

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

FxExpression * ParseParameter(FScanner *sc,PClassActor *cls,PType *type,bool constant)

{
  char *_statestring;
  PClass *dtype;
  bool bVar1;
  uint uVar2;
  FxMultiNameState *pFVar3;
  FxExpression *index;
  MetaClass *pMVar4;
  FxConstant *this;
  FScriptPosition local_128;
  FName local_118;
  undefined1 local_111;
  FScriptPosition local_110;
  undefined1 local_f9;
  FScriptPosition local_f8;
  undefined1 local_e1;
  FScriptPosition local_e0;
  undefined1 local_c9;
  FScriptPosition local_c8;
  ExpVal local_b8;
  undefined1 local_a8 [8];
  ExpVal val;
  int c;
  FString local_80;
  undefined1 local_71;
  FScriptPosition local_70;
  FName local_60;
  undefined1 local_59;
  FScriptPosition local_58 [2];
  FSoundID local_38;
  uint local_34;
  FxMultiNameState *pFStack_30;
  int v;
  FxExpression *x;
  PType *pPStack_20;
  bool constant_local;
  PType *type_local;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  pFStack_30 = (FxMultiNameState *)0x0;
  x._7_1_ = constant;
  pPStack_20 = type;
  type_local = (PType *)cls;
  cls_local = (PClassActor *)sc;
  if (type == (PType *)TypeSound) {
    FScanner::MustGetString(sc);
    pFVar3 = (FxMultiNameState *)operator_new(0x48);
    local_59 = 1;
    FSoundID::FSoundID(&local_38,
                       (char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.
                               super_PCompoundType.super_PType.super_DObject._vptr_DObject);
    FScriptPosition::FScriptPosition(local_58,(FScanner *)cls_local);
    FxConstant::FxConstant((FxConstant *)pFVar3,&local_38,local_58);
    local_59 = 0;
    pFStack_30 = pFVar3;
    FScriptPosition::~FScriptPosition(local_58);
  }
  else if (((type == (PType *)TypeBool) || (type == (PType *)TypeSInt32)) ||
          (type == (PType *)TypeFloat64)) {
    pFStack_30 = (FxMultiNameState *)ParseExpression(sc,cls,constant);
    if (((x._7_1_ & 1) != 0) &&
       (uVar2 = (*((FxExpression *)pFStack_30)->_vptr_FxExpression[3])(), (uVar2 & 1) == 0)) {
      FScanner::ScriptMessage((FScanner *)cls_local,"Default parameter must be constant.");
      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    }
    if (pPStack_20 == (PType *)TypeBool) {
      pFVar3 = (FxMultiNameState *)operator_new(0x40);
      FxBoolCast::FxBoolCast((FxBoolCast *)pFVar3,&pFStack_30->super_FxExpression);
      pFStack_30 = pFVar3;
    }
    else if (pPStack_20 == (PType *)TypeSInt32) {
      pFVar3 = (FxMultiNameState *)operator_new(0x40);
      FxIntCast::FxIntCast((FxIntCast *)pFVar3,&pFStack_30->super_FxExpression);
      pFStack_30 = pFVar3;
    }
    else {
      pFVar3 = (FxMultiNameState *)operator_new(0x40);
      FxFloatCast::FxFloatCast((FxFloatCast *)pFVar3,&pFStack_30->super_FxExpression);
      pFStack_30 = pFVar3;
    }
  }
  else if ((type == (PType *)TypeName) || (type == (PType *)TypeString)) {
    FScanner::SetEscape(sc,true);
    FScanner::MustGetString((FScanner *)cls_local);
    FScanner::SetEscape((FScanner *)cls_local,false);
    if (pPStack_20 == (PType *)TypeName) {
      pFVar3 = (FxMultiNameState *)operator_new(0x48);
      local_71 = 1;
      if (*(char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.super_DObject._vptr_DObject == '\0') {
        FName::FName(&local_60,NAME_None);
      }
      else {
        FName::FName(&local_60,
                     (char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.super_DObject._vptr_DObject);
      }
      FScriptPosition::FScriptPosition(&local_70,(FScanner *)cls_local);
      FxConstant::FxConstant((FxConstant *)pFVar3,&local_60,&local_70);
      local_71 = 0;
      pFStack_30 = pFVar3;
      FScriptPosition::~FScriptPosition(&local_70);
    }
    else {
      pFVar3 = (FxMultiNameState *)operator_new(0x48);
      val.field_1._7_1_ = 1;
      strbin1((char *)&local_80);
      FScriptPosition::FScriptPosition((FScriptPosition *)&c,(FScanner *)cls_local);
      FxConstant::FxConstant((FxConstant *)pFVar3,&local_80,(FScriptPosition *)&c);
      val.field_1._7_1_ = 0;
      pFStack_30 = pFVar3;
      FScriptPosition::~FScriptPosition((FScriptPosition *)&c);
      FString::~FString(&local_80);
    }
  }
  else if (type == (PType *)TypeColor) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare((FScanner *)cls_local,"none");
    if (bVar1) {
      local_34 = 0xffffffff;
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)cls_local,"");
      if (bVar1) {
        local_34 = 0;
      }
      else {
        val.field_1.Int =
             V_GetColor((DWORD *)0x0,
                        (char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.super_DObject._vptr_DObject);
        local_34 = (val.field_1.Int >> 0x10 & 0xffU) << 0x10 | 0x1000000 |
                   (val.field_1.Int >> 8 & 0xffU) << 8 | val.field_1.Int & 0xffU;
      }
    }
    ExpVal::ExpVal((ExpVal *)local_a8);
    local_a8 = (undefined1  [8])TypeColor;
    val.Type._0_4_ = local_34;
    pFVar3 = (FxMultiNameState *)operator_new(0x48);
    local_c9 = 1;
    ExpVal::ExpVal(&local_b8,(ExpVal *)local_a8);
    FScriptPosition::FScriptPosition(&local_c8,(FScanner *)cls_local);
    FxConstant::FxConstant((FxConstant *)pFVar3,&local_b8,&local_c8);
    local_c9 = 0;
    pFStack_30 = pFVar3;
    FScriptPosition::~FScriptPosition(&local_c8);
    ExpVal::~ExpVal(&local_b8);
    ExpVal::~ExpVal((ExpVal *)local_a8);
  }
  else if (type == (PType *)TypeState) {
    bVar1 = FScanner::CheckToken(sc,0x102);
    if (bVar1) {
      if ((*(char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                    super_PType.super_DObject._vptr_DObject == '\0') ||
         (bVar1 = FScanner::Compare((FScanner *)cls_local,"None"), bVar1)) {
        pFVar3 = (FxMultiNameState *)operator_new(0x48);
        local_e1 = 1;
        FScriptPosition::FScriptPosition(&local_e0,(FScanner *)cls_local);
        FxConstant::FxConstant((FxConstant *)pFVar3,(FState *)0x0,&local_e0);
        local_e1 = 0;
        pFStack_30 = pFVar3;
        FScriptPosition::~FScriptPosition(&local_e0);
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)cls_local,"*");
        if (bVar1) {
          if ((x._7_1_ & 1) == 0) {
            FScanner::ScriptError((FScanner *)cls_local,"Invalid state name \'*\'");
          }
          else {
            pFVar3 = (FxMultiNameState *)operator_new(0x48);
            local_f9 = 1;
            FScriptPosition::FScriptPosition(&local_f8,(FScanner *)cls_local);
            FxConstant::FxConstant((FxConstant *)pFVar3,(FState *)0xffffffffffffffff,&local_f8);
            local_f9 = 0;
            pFStack_30 = pFVar3;
            FScriptPosition::~FScriptPosition(&local_f8);
          }
        }
        else {
          pFVar3 = (FxMultiNameState *)operator_new(0x50);
          local_111 = 1;
          _statestring = (char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.super_DObject._vptr_DObject;
          FScriptPosition::FScriptPosition(&local_110,(FScanner *)cls_local);
          FxMultiNameState::FxMultiNameState(pFVar3,_statestring,&local_110);
          local_111 = 0;
          pFStack_30 = pFVar3;
          FScriptPosition::~FScriptPosition(&local_110);
        }
      }
    }
    else if ((x._7_1_ & 1) == 0) {
      pFVar3 = (FxMultiNameState *)operator_new(0x40);
      index = ParseExpression((FScanner *)cls_local,(PClassActor *)type_local,false);
      FxRuntimeStateIndex::FxRuntimeStateIndex((FxRuntimeStateIndex *)pFVar3,index);
      pFStack_30 = pFVar3;
    }
    else {
      FScanner::MustGetToken((FScanner *)cls_local,0x102);
    }
  }
  else {
    pMVar4 = PType::GetClass(type);
    if (pMVar4 != (MetaClass *)PClassPointer::RegistrationInfo.MyClass) {
      __assert_fail("false && \"Unknown parameter type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                    ,0xaf,"FxExpression *ParseParameter(FScanner &, PClassActor *, PType *, bool)");
    }
    FScanner::SetEscape((FScanner *)cls_local,true);
    FScanner::MustGetString((FScanner *)cls_local);
    FScanner::SetEscape((FScanner *)cls_local,false);
    pFVar3 = (FxMultiNameState *)operator_new(0x48);
    dtype = pPStack_20[1].super_DObject.Class;
    this = (FxConstant *)operator_new(0x48);
    FName::FName(&local_118,
                 (char *)(cls_local->super_PClass).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_DObject._vptr_DObject);
    FScriptPosition::FScriptPosition(&local_128,(FScanner *)cls_local);
    FxConstant::FxConstant(this,&local_118,&local_128);
    FxClassTypeCast::FxClassTypeCast((FxClassTypeCast *)pFVar3,dtype,(FxExpression *)this);
    pFStack_30 = pFVar3;
    FScriptPosition::~FScriptPosition(&local_128);
  }
  return &pFStack_30->super_FxExpression;
}

Assistant:

FxExpression *ParseParameter(FScanner &sc, PClassActor *cls, PType *type, bool constant)
{
	FxExpression *x = NULL;
	int v;

	if (type == TypeSound)
	{
		sc.MustGetString();
		x = new FxConstant(FSoundID(sc.String), sc);
	}
	else if (type == TypeBool || type == TypeSInt32 || type == TypeFloat64)
	{
		x = ParseExpression (sc, cls, constant);
		if (constant && !x->isConstant())
		{
			sc.ScriptMessage("Default parameter must be constant.");
			FScriptPosition::ErrorCounter++;
		}
		// Do automatic coercion between bools, ints and floats.
		if (type == TypeBool)
		{
			x = new FxBoolCast(x);
		}
		else if (type == TypeSInt32)
		{
			x = new FxIntCast(x);
		}
		else
		{
			x = new FxFloatCast(x);
		}
	}
	else if (type == TypeName || type == TypeString)
	{
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		if (type == TypeName)
		{
			x = new FxConstant(sc.String[0] ? FName(sc.String) : NAME_None, sc);
		}
		else
		{
			x = new FxConstant(strbin1(sc.String), sc);
		}
	}
	else if (type == TypeColor)
	{
		sc.MustGetString ();
		if (sc.Compare("none"))
		{
			v = -1;
		}
		else if (sc.Compare(""))
		{
			v = 0;
		}
		else
		{
			int c = V_GetColor (NULL, sc.String);
			// 0 needs to be the default so we have to mark the color.
			v = MAKEARGB(1, RPART(c), GPART(c), BPART(c));
		}
		ExpVal val;
		val.Type = TypeColor;
		val.Int = v;
		x = new FxConstant(val, sc);
	}
	else if (type == TypeState)
	{
		// This forces quotation marks around the state name.
		if (sc.CheckToken(TK_StringConst))
		{
			if (sc.String[0] == 0 || sc.Compare("None"))
			{
				x = new FxConstant((FState*)NULL, sc);
			}
			else if (sc.Compare("*"))
			{
				if (constant)
				{
					x = new FxConstant((FState*)(intptr_t)-1, sc);
				}
				else sc.ScriptError("Invalid state name '*'");
			}
			else
			{
				x = new FxMultiNameState(sc.String, sc);
			}
		}
		else if (!constant)
		{
			x = new FxRuntimeStateIndex(ParseExpression(sc, cls));
		}
		else sc.MustGetToken(TK_StringConst); // This is for the error.
	}
	else if (type->GetClass() == RUNTIME_CLASS(PClassPointer))
	{	// Actor name
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		x = new FxClassTypeCast(static_cast<PClassPointer *>(type)->ClassRestriction, new FxConstant(FName(sc.String), sc));
	}
	else
	{
		assert(false && "Unknown parameter type");
		x = NULL;
	}
	return x;
}